

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O2

int main(int argc,char **argv)

{
  N_Vector p_Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint onoff;
  N_Vector p_Var6;
  void *flagvalue;
  long lVar7;
  SUNLinearSolver p_Var8;
  char *__s;
  long lVar9;
  sunrealtype sVar10;
  int fails;
  N_Vector local_88;
  N_Vector local_80;
  double local_78;
  ulong local_70;
  void *local_68;
  SUNContext sunctx;
  SUNLinearSolver local_58;
  UserData ProbData;
  
  fails = 0;
  iVar2 = SUNContext_Create(0,&sunctx);
  if (iVar2 == 0) {
    iVar2 = 1;
    if (argc < 7) {
      puts("ERROR: SIX (6) Inputs required:");
      puts("  Problem size should be >0");
      puts("  Gram-Schmidt orthogonalization type should be 1 or 2");
      puts("  Preconditioning type should be 1 or 2");
      puts("  Maximum Krylov subspace dimension should be >0");
      puts("  Solver tolerance should be >0");
      __s = "  timing output flag should be 0 or 1 ";
    }
    else {
      problem_size = atol(argv[1]);
      ProbData.N = problem_size;
      if (problem_size < 1) {
        __s = "ERROR: Problem size must be a positive integer";
      }
      else {
        uVar3 = atoi(argv[2]);
        if (uVar3 - 3 < 0xfffffffe) {
          __s = "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2";
        }
        else {
          uVar4 = atoi(argv[3]);
          if (uVar4 - 3 < 0xfffffffe) {
            __s = "ERROR: Preconditioning type must be either 1 or 2";
          }
          else {
            uVar5 = atoi(argv[4]);
            if ((int)uVar5 < 1) {
              __s = "ERROR: Maximum Krylov subspace dimension must be a positive integer";
            }
            else {
              local_78 = atof(argv[5]);
              if (0.0 < local_78) {
                onoff = atoi(argv[6]);
                SetTiming(onoff);
                puts("\nSPGMR linear solver test:");
                printf("  Problem size = %ld\n",ProbData.N);
                printf("  Gram-Schmidt orthogonalization type = %i\n",(ulong)uVar3);
                printf("  Preconditioning type = %i\n",(ulong)uVar4);
                printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar5);
                printf("  Solver Tolerance = %g\n",local_78);
                printf("  timing output flag = %i\n\n",(ulong)onoff);
                p_Var6 = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
                iVar2 = check_flag(p_Var6,"N_VNew_Serial",0);
                if (iVar2 != 0) {
                  return 1;
                }
                flagvalue = (void *)N_VNew_Serial(ProbData.N,sunctx);
                iVar2 = check_flag(flagvalue,"N_VNew_Serial",0);
                if (iVar2 != 0) {
                  return 1;
                }
                local_88 = p_Var6;
                p_Var6 = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
                iVar2 = check_flag(p_Var6,"N_VNew_Serial",0);
                if (iVar2 != 0) {
                  return 1;
                }
                local_80 = p_Var6;
                ProbData.d = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
                iVar2 = check_flag(ProbData.d,"N_VNew_Serial",0);
                if (iVar2 != 0) {
                  return 1;
                }
                ProbData.s1 = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
                iVar2 = check_flag(ProbData.s1,"N_VNew_Serial",0);
                if (iVar2 != 0) {
                  return 1;
                }
                local_68 = flagvalue;
                ProbData.s2 = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
                iVar2 = check_flag(ProbData.s2,"N_VNew_Serial",0);
                if (iVar2 != 0) {
                  return 1;
                }
                lVar7 = N_VGetArrayPointer(local_68);
                for (lVar9 = 0; lVar9 < ProbData.N; lVar9 = lVar9 + 1) {
                  sVar10 = urand();
                  *(double *)(lVar7 + lVar9 * 8) = sVar10 + 1.0;
                }
                N_VConst(0x4014000000000000,ProbData.d);
                p_Var8 = (SUNLinearSolver)SUNLinSol_SPGMR(local_88,uVar4,uVar5);
                iVar2 = Test_SUNLinSolGetType(p_Var8,SUNLINEARSOLVER_ITERATIVE,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolGetID(p_Var8,SUNLINEARSOLVER_SPGMR,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetATimes(p_Var8,&ProbData,ATimes,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetPreconditioner(p_Var8,&ProbData,PSetup,PSolve,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetScalingVectors(p_Var8,ProbData.s1,ProbData.s2,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetZeroGuess(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolInitialize(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSpace(p_Var8,0);
                fails = fails + iVar2;
                local_58 = p_Var8;
                iVar2 = SUNLinSol_SPGMRSetGSType(p_Var8,uVar3);
                fails = iVar2 + fails;
                if (fails != 0) {
                  printf("FAIL: SUNLinSol_SPGMR module failed %i initialization tests\n\n",
                         (ulong)(uint)fails);
                  return 1;
                }
                puts("SUCCESS: SUNLinSol_SPGMR module passed all initialization tests\n");
                N_VConst(0x3ff0000000000000,ProbData.s1);
                N_VConst(0x3ff0000000000000,ProbData.s2);
                p_Var6 = local_88;
                N_VDiv(local_68,ProbData.s2,local_88);
                fails = ATimes(&ProbData,p_Var6,local_80);
                iVar2 = check_flag(&fails,"ATimes",1);
                p_Var8 = local_58;
                if (iVar2 != 0) {
                  return 1;
                }
                local_70 = 0;
                iVar2 = SUNLinSol_SPGMRSetPrecType(local_58);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetup(p_Var8,(SUNMatrix)0x0,0);
                p_Var1 = local_80;
                p_Var6 = local_88;
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,local_88,local_80,local_78,1,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,p_Var6,p_Var1,local_78,0,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolLastFlag(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolNumIters(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResNorm(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResid(p_Var8,0);
                fails = iVar2 + fails;
                if (fails == 0) {
                  puts("SUCCESS: SUNLinSol_SPGMR module, problem 1, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_SPGMR module, problem 1, failed %i tests\n\n",
                         (ulong)(uint)fails);
                  local_70 = 1;
                }
                N_VConst(0x3ff0000000000000,ProbData.s1);
                N_VConst(0x3ff0000000000000,ProbData.s2);
                p_Var6 = local_88;
                N_VDiv(local_68,ProbData.s2,local_88);
                fails = ATimes(&ProbData,p_Var6,local_80);
                iVar2 = check_flag(&fails,"ATimes",1);
                p_Var8 = local_58;
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = SUNLinSol_SPGMRSetPrecType(local_58);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetup(p_Var8,(SUNMatrix)0x0,0);
                p_Var1 = local_80;
                p_Var6 = local_88;
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,local_88,local_80,local_78,1,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,p_Var6,p_Var1,local_78,0,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolLastFlag(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolNumIters(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResNorm(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResid(p_Var8,0);
                fails = iVar2 + fails;
                if (fails == 0) {
                  puts("SUCCESS: SUNLinSol_SPGMR module, problem 2, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_SPGMR module, problem 2, failed %i tests\n\n",
                         (ulong)(uint)fails);
                  local_70 = (ulong)((int)local_70 + 1);
                }
                lVar7 = N_VGetArrayPointer(ProbData.s1);
                for (lVar9 = 0; lVar9 < ProbData.N; lVar9 = lVar9 + 1) {
                  sVar10 = urand();
                  *(double *)(lVar7 + lVar9 * 8) = sVar10 * 1000.0 + 1.0;
                }
                N_VConst(0x3ff0000000000000,ProbData.s2);
                p_Var6 = local_88;
                N_VDiv(local_68,ProbData.s2,local_88);
                fails = ATimes(&ProbData,p_Var6,local_80);
                iVar2 = check_flag(&fails,"ATimes",1);
                p_Var8 = local_58;
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = SUNLinSol_SPGMRSetPrecType(local_58);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetup(p_Var8,(SUNMatrix)0x0,0);
                p_Var1 = local_80;
                p_Var6 = local_88;
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,local_88,local_80,local_78,1,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,p_Var6,p_Var1,local_78,0,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolLastFlag(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolNumIters(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResNorm(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResid(p_Var8,0);
                fails = iVar2 + fails;
                if (fails == 0) {
                  puts("SUCCESS: SUNLinSol_SPGMR module, problem 3, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_SPGMR module, problem 3, failed %i tests\n\n",
                         (ulong)(uint)fails);
                  local_70 = (ulong)((int)local_70 + 1);
                }
                lVar7 = N_VGetArrayPointer(ProbData.s1);
                for (lVar9 = 0; lVar9 < ProbData.N; lVar9 = lVar9 + 1) {
                  sVar10 = urand();
                  *(double *)(lVar7 + lVar9 * 8) = sVar10 * 1000.0 + 1.0;
                }
                N_VConst(0x3ff0000000000000,ProbData.s2);
                p_Var6 = local_88;
                N_VDiv(local_68,ProbData.s2,local_88);
                fails = ATimes(&ProbData,p_Var6,local_80);
                iVar2 = check_flag(&fails,"ATimes",1);
                p_Var8 = local_58;
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = SUNLinSol_SPGMRSetPrecType(local_58);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetup(p_Var8,(SUNMatrix)0x0,0);
                p_Var1 = local_80;
                p_Var6 = local_88;
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,local_88,local_80,local_78,1,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,p_Var6,p_Var1,local_78,0,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolLastFlag(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolNumIters(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResNorm(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResid(p_Var8,0);
                fails = iVar2 + fails;
                if (fails == 0) {
                  puts("SUCCESS: SUNLinSol_SPGMR module, problem 4, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_SPGMR module, problem 4, failed %i tests\n\n",
                         (ulong)(uint)fails);
                  local_70 = (ulong)((int)local_70 + 1);
                }
                N_VConst(0x3ff0000000000000,ProbData.s1);
                lVar7 = N_VGetArrayPointer(ProbData.s2);
                for (lVar9 = 0; p_Var6 = local_88, lVar9 < ProbData.N; lVar9 = lVar9 + 1) {
                  sVar10 = urand();
                  *(double *)(lVar7 + lVar9 * 8) = sVar10 * 1000.0 + 1.0;
                }
                N_VDiv(local_68,ProbData.s2,local_88);
                fails = ATimes(&ProbData,p_Var6,local_80);
                iVar2 = check_flag(&fails,"ATimes",1);
                p_Var8 = local_58;
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = SUNLinSol_SPGMRSetPrecType(local_58);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetup(p_Var8,(SUNMatrix)0x0,0);
                p_Var1 = local_80;
                p_Var6 = local_88;
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,local_88,local_80,local_78,1,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,p_Var6,p_Var1,local_78,0,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolLastFlag(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolNumIters(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResNorm(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResid(p_Var8,0);
                fails = iVar2 + fails;
                if (fails == 0) {
                  puts("SUCCESS: SUNLinSol_SPGMR module, problem 5, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_SPGMR module, problem 5, failed %i tests\n\n",
                         (ulong)(uint)fails);
                  local_70 = (ulong)((int)local_70 + 1);
                }
                N_VConst(0x3ff0000000000000,ProbData.s1);
                lVar7 = N_VGetArrayPointer(ProbData.s2);
                for (lVar9 = 0; p_Var6 = local_88, lVar9 < ProbData.N; lVar9 = lVar9 + 1) {
                  sVar10 = urand();
                  *(double *)(lVar7 + lVar9 * 8) = sVar10 * 1000.0 + 1.0;
                }
                N_VDiv(local_68,ProbData.s2,local_88);
                fails = ATimes(&ProbData,p_Var6,local_80);
                iVar2 = check_flag(&fails,"ATimes",1);
                p_Var8 = local_58;
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = SUNLinSol_SPGMRSetPrecType(local_58);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSetup(p_Var8,(SUNMatrix)0x0,0);
                p_Var1 = local_80;
                p_Var6 = local_88;
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,local_88,local_80,local_78,1,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolSolve(p_Var8,(SUNMatrix)0x0,p_Var6,p_Var1,local_78,0,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolLastFlag(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolNumIters(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResNorm(p_Var8,0);
                fails = fails + iVar2;
                iVar2 = Test_SUNLinSolResid(p_Var8,0);
                fails = iVar2 + fails;
                if (fails == 0) {
                  puts("SUCCESS: SUNLinSol_SPGMR module, problem 6, passed all tests\n");
                }
                else {
                  printf("FAIL: SUNLinSol_SPGMR module, problem 6, failed %i tests\n\n",
                         (ulong)(uint)fails);
                  local_70 = (ulong)((int)local_70 + 1);
                }
                SUNLinSolFree(local_58);
                N_VDestroy(local_88);
                N_VDestroy(local_68);
                N_VDestroy(local_80);
                N_VDestroy(ProbData.d);
                N_VDestroy(ProbData.s1);
                N_VDestroy(ProbData.s2);
                SUNContext_Free(&sunctx);
                return (int)local_70;
              }
              __s = "ERROR: Solver tolerance must be a positive real number";
            }
          }
        }
      }
    }
    puts(__s);
  }
  else {
    puts("ERROR: SUNContext_Create failed");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int gstype, pretype, maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 7)
  {
    printf("ERROR: SIX (6) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Gram-Schmidt orthogonalization type should be 1 or 2\n");
    printf("  Preconditioning type should be 1 or 2\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  gstype = atoi(argv[2]);
  if ((gstype < 1) || (gstype > 2))
  {
    printf(
      "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2\n");
    return 1;
  }
  pretype = atoi(argv[3]);
  if ((pretype < 1) || (pretype > 2))
  {
    printf("ERROR: Preconditioning type must be either 1 or 2\n");
    return 1;
  }
  maxl = atoi(argv[4]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[5]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[6]);
  SetTiming(print_timing);

  printf("\nSPGMR linear solver test:\n");
  printf("  Problem size = %ld\n", (long int)ProbData.N);
  printf("  Gram-Schmidt orthogonalization type = %i\n", gstype);
  printf("  Preconditioning type = %i\n", pretype);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s1 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s1, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s2 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s2, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create SPGMR linear solver */
  LS = SUNLinSol_SPGMR(x, pretype, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_SPGMR, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s1, ProbData.s2, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  fails += SUNLinSol_SPGMRSetGSType(LS, gstype);
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf(
      "SUCCESS: SUNLinSol_SPGMR module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 1, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 2, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaled rows (no preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 3, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaled rows (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 4, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 4, passed all tests\n\n");
  }

  /*** Test 5: Poisson-like solve w/ scaled columns (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 5, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 5, passed all tests\n\n");
  }

  /*** Test 6: Poisson-like solve w/ scaled columns (Jacobi preconditioning) ***/

  /* set scaling vector, Jacobi solver vector */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 6, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 6, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s1);
  N_VDestroy(ProbData.s2);
  SUNContext_Free(&sunctx);

  return (passfail);
}